

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v10::vprint(FILE *f,string_view fmt,format_args args)

{
  undefined8 this;
  char *s;
  size_t count;
  size_t sVar1;
  string_view text;
  basic_string_view<char> local_2a0;
  size_t local_288;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_280;
  char *local_278;
  size_t local_270;
  allocator<char> local_251;
  undefined1 local_250 [8];
  memory_buffer buffer;
  FILE *f_local;
  format_args args_local;
  string_view fmt_local;
  
  sVar1 = args.desc_;
  buffer._528_8_ = f;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250,&local_251);
  std::allocator<char>::~allocator(&local_251);
  local_288 = sVar1;
  local_280 = args.field_1;
  local_278 = fmt.data_;
  local_270 = fmt.size_;
  detail::vformat_to<char>((buffer<char> *)local_250,fmt,args,(locale_ref)0x0);
  this = buffer._528_8_;
  s = detail::buffer<char>::data((buffer<char> *)local_250);
  count = detail::buffer<char>::size((buffer<char> *)local_250);
  basic_string_view<char>::basic_string_view(&local_2a0,s,count);
  text.size_ = sVar1;
  text.data_ = (char *)local_2a0.size_;
  detail::print((detail *)this,(FILE *)local_2a0.data_,text);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_250);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view fmt, format_args args) {
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  detail::print(f, {buffer.data(), buffer.size()});
}